

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportLibraryDependenciesCommand.cxx
# Opt level: O1

void __thiscall
cmExportLibraryDependenciesCommand::ConstFinalPass(cmExportLibraryDependenciesCommand *this)

{
  _Hash_node_base *p_Var1;
  size_type sVar2;
  int iVar3;
  cmake *pcVar4;
  pointer ppcVar5;
  cmTarget *this_00;
  mapped_type *pmVar6;
  ostream *poVar7;
  _Rb_tree_node_base *p_Var8;
  _Rb_tree_node_base *p_Var9;
  char *pcVar10;
  _Hash_node_base *p_Var11;
  _Hash_node_base *p_Var12;
  string valueNew;
  string ltValue;
  string lib;
  string valueOld;
  string targetEntry;
  string ltVar;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  libDepsOld;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  libTypes;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  libDepsNew;
  cmGeneratedFileStream *local_1c8;
  undefined1 *local_1c0;
  undefined8 local_1b8;
  undefined1 local_1b0;
  undefined7 uStack_1af;
  undefined1 *local_1a0;
  char *local_198;
  undefined1 local_190;
  undefined7 uStack_18f;
  string local_180;
  undefined1 *local_160;
  undefined8 local_158;
  undefined1 local_150;
  undefined7 uStack_14f;
  key_type local_140;
  string local_120;
  key_type local_100;
  pointer local_e0;
  pointer local_d8;
  _Hash_node_base *local_d0;
  cmGlobalGenerator *local_c8;
  undefined1 local_c0 [32];
  _Rb_tree_node_base *local_a0;
  size_t local_98;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_90;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  if (this->Append == true) {
    pcVar10 = (this->Filename)._M_dataplus._M_p;
    local_1c8 = (cmGeneratedFileStream *)operator_new(0x200);
    std::ofstream::ofstream(local_1c8,pcVar10,_S_app);
  }
  else {
    local_1c8 = (cmGeneratedFileStream *)operator_new(0x248);
    cmGeneratedFileStream::cmGeneratedFileStream(local_1c8,&this->Filename,true,None);
    cmGeneratedFileStream::SetCopyIfDifferent(local_1c8,true);
  }
  if (((&(local_1c8->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
       [(long)(local_1c8->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
              _vptr_basic_ostream[-3]] & 5) == 0) {
    pcVar4 = cmMakefile::GetCMakeInstance((this->super_cmCommand).Makefile);
    local_c8 = pcVar4->GlobalGenerator;
    local_c0._24_8_ = local_c0 + 8;
    local_c0._8_4_ = _S_red;
    local_c0._16_8_ = 0;
    local_98 = 0;
    local_60._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_60._M_impl.super__Rb_tree_header._M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_90._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_90._M_impl.super__Rb_tree_header._M_header;
    local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
    ppcVar5 = (local_c8->Makefiles).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    local_e0 = (local_c8->Makefiles).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    local_a0 = (_Rb_tree_node_base *)local_c0._24_8_;
    local_90._M_impl.super__Rb_tree_header._M_header._M_right =
         local_90._M_impl.super__Rb_tree_header._M_header._M_left;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right =
         local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    if (ppcVar5 != local_e0) {
      do {
        local_d8 = ppcVar5;
        for (p_Var12 = ((*ppcVar5)->Targets)._M_h._M_before_begin._M_nxt;
            p_Var12 != (_Hash_node_base *)0x0; p_Var12 = p_Var12->_M_nxt) {
          if (0xfffffffc < *(int *)&p_Var12[0x3a]._M_nxt - 4U) {
            local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_140,p_Var12[0x1d]._M_nxt,
                       (long)&(p_Var12[0x1d]._M_nxt)->_M_nxt + (long)&(p_Var12[0x1e]._M_nxt)->_M_nxt
                      );
            std::__cxx11::string::append((char *)&local_140);
            local_160 = &local_150;
            local_158 = 0;
            local_150 = 0;
            local_1c0 = &local_1b0;
            local_1b8 = 0;
            local_1b0 = 0;
            p_Var1 = p_Var12[0x36]._M_nxt;
            local_d0 = p_Var12;
            for (p_Var11 = p_Var12[0x35]._M_nxt; p_Var11 != p_Var1; p_Var11 = p_Var11 + 5) {
              local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_100,p_Var11->_M_nxt,
                         (long)&p_Var11->_M_nxt->_M_nxt + (long)&(p_Var11[1]._M_nxt)->_M_nxt);
              std::__cxx11::string::append((char *)&local_100);
              local_1a0 = &local_190;
              local_198 = (char *)0x0;
              local_190 = 0;
              iVar3 = *(int *)&p_Var11[4]._M_nxt;
              if (iVar3 == 0) {
                std::__cxx11::string::append((char *)&local_1c0);
                pcVar10 = "general";
LAB_001dbc4b:
                std::__cxx11::string::_M_replace((ulong)&local_1a0,0,local_198,(ulong)pcVar10);
              }
              else {
                if (iVar3 == 1) {
                  std::__cxx11::string::append((char *)&local_1c0);
                  pcVar10 = "debug";
                  goto LAB_001dbc4b;
                }
                if (iVar3 == 2) {
                  std::__cxx11::string::append((char *)&local_1c0);
                  pcVar10 = "optimized";
                  goto LAB_001dbc4b;
                }
              }
              local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_180,p_Var11->_M_nxt,
                         (long)&p_Var11->_M_nxt->_M_nxt + (long)&(p_Var11[1]._M_nxt)->_M_nxt);
              this_00 = cmGlobalGenerator::FindTarget(local_c8,&local_180,false);
              if (this_00 != (cmTarget *)0x0) {
                local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_120,"OUTPUT_NAME","");
                pcVar10 = cmTarget::GetProperty(this_00,&local_120);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_120._M_dataplus._M_p != &local_120.field_2) {
                  operator_delete(local_120._M_dataplus._M_p,
                                  local_120.field_2._M_allocated_capacity + 1);
                }
                sVar2 = local_180._M_string_length;
                if (pcVar10 != (char *)0x0) {
                  strlen(pcVar10);
                  std::__cxx11::string::_M_replace((ulong)&local_180,0,(char *)sVar2,(ulong)pcVar10)
                  ;
                }
              }
              std::__cxx11::string::_M_append((char *)&local_160,(ulong)local_180._M_dataplus._M_p);
              std::__cxx11::string::append((char *)&local_160);
              std::__cxx11::string::_M_append((char *)&local_1c0,(ulong)local_180._M_dataplus._M_p);
              std::__cxx11::string::append((char *)&local_1c0);
              pmVar6 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&local_90,&local_100);
              pcVar10 = (char *)pmVar6->_M_string_length;
              if (pcVar10 == (char *)0x0) {
                std::__cxx11::string::_M_assign((string *)pmVar6);
              }
              else if ((pcVar10 != local_198) ||
                      (iVar3 = bcmp((pmVar6->_M_dataplus)._M_p,local_1a0,(size_t)pcVar10),
                      iVar3 != 0)) {
                std::__cxx11::string::_M_replace((ulong)pmVar6,0,pcVar10,0x4b13a4);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_180._M_dataplus._M_p != &local_180.field_2) {
                operator_delete(local_180._M_dataplus._M_p,
                                local_180.field_2._M_allocated_capacity + 1);
              }
              if (local_1a0 != &local_190) {
                operator_delete(local_1a0,CONCAT71(uStack_18f,local_190) + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_100._M_dataplus._M_p != &local_100.field_2) {
                operator_delete(local_100._M_dataplus._M_p,
                                local_100.field_2._M_allocated_capacity + 1);
              }
            }
            pmVar6 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)&local_60,&local_140);
            std::__cxx11::string::_M_assign((string *)pmVar6);
            pmVar6 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)local_c0,&local_140);
            std::__cxx11::string::_M_assign((string *)pmVar6);
            if (local_1c0 != &local_1b0) {
              operator_delete(local_1c0,CONCAT71(uStack_1af,local_1b0) + 1);
            }
            p_Var12 = local_d0;
            if (local_160 != &local_150) {
              operator_delete(local_160,CONCAT71(uStack_14f,local_150) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_140._M_dataplus._M_p != &local_140.field_2) {
              operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1
                             );
            }
          }
        }
        ppcVar5 = local_d8 + 1;
      } while (ppcVar5 != local_e0);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c8,"# Generated by CMake\n\n",0x16);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"if(",3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c8,"\"${CMAKE_MAJOR_VERSION}.${CMAKE_MINOR_VERSION}\" GREATER 2.4",
               0x3b);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,")\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c8,"  # Information for CMake 2.6 and above.\n",0x29);
    p_Var8 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left !=
        &local_60._M_impl.super__Rb_tree_header) {
      do {
        if (p_Var8[2]._M_parent != (_Base_ptr)0x0) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"  set(\"",7);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1c8,*(char **)(p_Var8 + 1),(long)p_Var8[1]._M_parent)
          ;
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\" \"",3);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,*(char **)(p_Var8 + 2),(long)p_Var8[2]._M_parent);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\")\n",3);
        }
        p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
      } while ((_Rb_tree_header *)p_Var8 != &local_60._M_impl.super__Rb_tree_header);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"else()\n",7);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c8,"  # Information for CMake 2.4 and lower.\n",0x29);
    p_Var8 = (_Rb_tree_node_base *)local_c0._24_8_;
    p_Var9 = local_90._M_impl.super__Rb_tree_header._M_header._M_left;
    while (local_90._M_impl.super__Rb_tree_header._M_header._M_left = p_Var9,
          p_Var8 != (_Rb_tree_node_base *)(local_c0 + 8)) {
      if (p_Var8[2]._M_parent != (_Base_ptr)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"  set(\"",7);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1c8,*(char **)(p_Var8 + 1),(long)p_Var8[1]._M_parent);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\" \"",3);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,*(char **)(p_Var8 + 2),(long)p_Var8[2]._M_parent);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\")\n",3);
      }
      p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
      p_Var9 = local_90._M_impl.super__Rb_tree_header._M_header._M_left;
    }
    if ((_Rb_tree_header *)p_Var9 != &local_90._M_impl.super__Rb_tree_header) {
      do {
        iVar3 = std::__cxx11::string::compare((char *)(p_Var9 + 2));
        if (iVar3 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"  set(\"",7);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1c8,*(char **)(p_Var9 + 1),(long)p_Var9[1]._M_parent)
          ;
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\" \"",3);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,*(char **)(p_Var9 + 2),(long)p_Var9[2]._M_parent);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\")\n",3);
        }
        p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
      } while ((_Rb_tree_header *)p_Var9 != &local_90._M_impl.super__Rb_tree_header);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"endif()\n",8);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_90);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_60);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_c0);
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0,
                   "Error Writing ",&this->Filename);
    cmSystemTools::Error((string *)local_c0);
    if ((undefined1 *)local_c0._0_8_ != local_c0 + 0x10) {
      operator_delete((void *)local_c0._0_8_,local_c0._16_8_ + 1);
    }
    cmSystemTools::ReportLastSystemError("");
  }
  (*(local_1c8->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
    _vptr_basic_ostream[1])();
  return;
}

Assistant:

void cmExportLibraryDependenciesCommand::ConstFinalPass() const
{
  // Use copy-if-different if not appending.
  std::unique_ptr<cmsys::ofstream> foutPtr;
  if (this->Append) {
    const auto openmodeApp = std::ios::app;
    foutPtr =
      cm::make_unique<cmsys::ofstream>(this->Filename.c_str(), openmodeApp);
  } else {
    std::unique_ptr<cmGeneratedFileStream> ap(
      new cmGeneratedFileStream(this->Filename, true));
    ap->SetCopyIfDifferent(true);
    foutPtr = std::move(ap);
  }
  std::ostream& fout = *foutPtr;

  if (!fout) {
    cmSystemTools::Error("Error Writing " + this->Filename);
    cmSystemTools::ReportLastSystemError("");
    return;
  }

  // Collect dependency information about all library targets built in
  // the project.
  cmake* cm = this->Makefile->GetCMakeInstance();
  cmGlobalGenerator* global = cm->GetGlobalGenerator();
  const std::vector<cmMakefile*>& locals = global->GetMakefiles();
  std::map<std::string, std::string> libDepsOld;
  std::map<std::string, std::string> libDepsNew;
  std::map<std::string, std::string> libTypes;
  for (cmMakefile* local : locals) {
    const cmTargets& tgts = local->GetTargets();
    for (auto const& tgt : tgts) {
      // Get the current target.
      cmTarget const& target = tgt.second;

      // Skip non-library targets.
      if (target.GetType() < cmStateEnums::STATIC_LIBRARY ||
          target.GetType() > cmStateEnums::MODULE_LIBRARY) {
        continue;
      }

      // Construct the dependency variable name.
      std::string targetEntry = target.GetName();
      targetEntry += "_LIB_DEPENDS";

      // Construct the dependency variable value with the direct link
      // dependencies.
      std::string valueOld;
      std::string valueNew;
      cmTarget::LinkLibraryVectorType const& libs =
        target.GetOriginalLinkLibraries();
      for (cmTarget::LibraryID const& li : libs) {
        std::string ltVar = li.first;
        ltVar += "_LINK_TYPE";
        std::string ltValue;
        switch (li.second) {
          case GENERAL_LibraryType:
            valueNew += "general;";
            ltValue = "general";
            break;
          case DEBUG_LibraryType:
            valueNew += "debug;";
            ltValue = "debug";
            break;
          case OPTIMIZED_LibraryType:
            valueNew += "optimized;";
            ltValue = "optimized";
            break;
        }
        std::string lib = li.first;
        if (cmTarget* libtgt = global->FindTarget(lib)) {
          // Handle simple output name changes.  This command is
          // deprecated so we do not support full target name
          // translation (which requires per-configuration info).
          if (const char* outname = libtgt->GetProperty("OUTPUT_NAME")) {
            lib = outname;
          }
        }
        valueOld += lib;
        valueOld += ";";
        valueNew += lib;
        valueNew += ";";

        std::string& ltEntry = libTypes[ltVar];
        if (ltEntry.empty()) {
          ltEntry = ltValue;
        } else if (ltEntry != ltValue) {
          ltEntry = "general";
        }
      }
      libDepsNew[targetEntry] = valueNew;
      libDepsOld[targetEntry] = valueOld;
    }
  }

  // Generate dependency information for both old and new style CMake
  // versions.
  const char* vertest =
    "\"${CMAKE_MAJOR_VERSION}.${CMAKE_MINOR_VERSION}\" GREATER 2.4";
  fout << "# Generated by CMake\n\n";
  fout << "if(" << vertest << ")\n";
  fout << "  # Information for CMake 2.6 and above.\n";
  for (auto const& i : libDepsNew) {
    if (!i.second.empty()) {
      fout << "  set(\"" << i.first << "\" \"" << i.second << "\")\n";
    }
  }
  fout << "else()\n";
  fout << "  # Information for CMake 2.4 and lower.\n";
  for (auto const& i : libDepsOld) {
    if (!i.second.empty()) {
      fout << "  set(\"" << i.first << "\" \"" << i.second << "\")\n";
    }
  }
  for (auto const& i : libTypes) {
    if (i.second != "general") {
      fout << "  set(\"" << i.first << "\" \"" << i.second << "\")\n";
    }
  }
  fout << "endif()\n";
}